

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::IEEEFloat::initFromPPCDoubleDoubleAPInt(IEEEFloat *this,APInt *api)

{
  anon_union_8_2_1313ab2f_for_U aVar1;
  opStatus oVar2;
  bool losesInfo;
  IEEEFloat v;
  bool local_41;
  anon_union_8_2_1313ab2f_for_U local_40;
  undefined4 local_38;
  anon_union_8_2_1313ab2f_for_U local_28;
  undefined4 local_20;
  
  if (api->BitWidth != 0x80) {
    __assert_fail("api.getBitWidth()==128",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc03,"void llvm::detail::IEEEFloat::initFromPPCDoubleDoubleAPInt(const APInt &)"
                 );
  }
  local_40 = *(anon_union_8_2_1313ab2f_for_U *)(api->U).pVal;
  aVar1 = ((anon_union_8_2_1313ab2f_for_U *)(api->U).pVal)[1];
  local_38 = 0x40;
  APInt::clearUnusedBits((APInt *)&local_40);
  initFromDoubleAPInt(this,(APInt *)&local_40);
  APInt::~APInt((APInt *)&local_40);
  oVar2 = convert(this,(fltSemantics *)semPPCDoubleDoubleLegacy,rmNearestTiesToEven,&local_41);
  if ((oVar2 == opOK) && ((local_41 & 1U) == 0)) {
    if ((this->field_0x12 & 7) != 3 && (this->field_0x12 & 6) != 0) {
      local_20 = 0x40;
      local_28 = aVar1;
      APInt::clearUnusedBits((APInt *)&local_28);
      IEEEFloat((IEEEFloat *)&local_40,(fltSemantics *)semIEEEdouble,(APInt *)&local_28);
      APInt::~APInt((APInt *)&local_28);
      oVar2 = convert((IEEEFloat *)&local_40,(fltSemantics *)semPPCDoubleDoubleLegacy,
                      rmNearestTiesToEven,&local_41);
      if ((oVar2 != opOK) || ((local_41 & 1U) != 0)) {
        __assert_fail("fs == opOK && !losesInfo",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xc13,
                      "void llvm::detail::IEEEFloat::initFromPPCDoubleDoubleAPInt(const APInt &)");
      }
      add(this,(IEEEFloat *)&local_40,rmNearestTiesToEven);
      ~IEEEFloat((IEEEFloat *)&local_40);
    }
    return;
  }
  __assert_fail("fs == opOK && !losesInfo",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xc0c,"void llvm::detail::IEEEFloat::initFromPPCDoubleDoubleAPInt(const APInt &)");
}

Assistant:

void IEEEFloat::initFromPPCDoubleDoubleAPInt(const APInt &api) {
  assert(api.getBitWidth()==128);
  uint64_t i1 = api.getRawData()[0];
  uint64_t i2 = api.getRawData()[1];
  opStatus fs;
  bool losesInfo;

  // Get the first double and convert to our format.
  initFromDoubleAPInt(APInt(64, i1));
  fs = convert(semPPCDoubleDoubleLegacy, rmNearestTiesToEven, &losesInfo);
  assert(fs == opOK && !losesInfo);
  (void)fs;

  // Unless we have a special case, add in second double.
  if (isFiniteNonZero()) {
    IEEEFloat v(semIEEEdouble, APInt(64, i2));
    fs = v.convert(semPPCDoubleDoubleLegacy, rmNearestTiesToEven, &losesInfo);
    assert(fs == opOK && !losesInfo);
    (void)fs;

    add(v, rmNearestTiesToEven);
  }
}